

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkmaze.c
# Opt level: O2

void water_friction(schar *udx,schar *udy)

{
  xchar xVar1;
  boolean bVar2;
  uint uVar3;
  int iVar4;
  schar *psVar5;
  byte bVar6;
  int iVar7;
  int iVar8;
  schar *psVar9;
  
  if ((((u.uprops[0x39].extrinsic != 0 || u.uprops[0x39].intrinsic != 0) ||
       (((youmonst.data)->mflags1 & 2) != 0)) ||
      ((u.usteed != (monst *)0x0 && (((u.usteed)->data->mflags1 & 2) != 0)))) &&
     (uVar3 = mt_random(), (uVar3 & 3) != 0)) {
    return;
  }
  if ((*udx == '\0') || (iVar4 = rn2((uint)(*udy != '\0') * 3 + 3), iVar4 != 0)) {
    if (*udy == '\0') {
      return;
    }
    iVar4 = rn2((uint)(*udx != '\0') * 2 + 3);
    xVar1 = u.uy;
    if (iVar4 != 0) {
      return;
    }
    iVar4 = (int)u.uy;
    do {
      uVar3 = mt_random();
      iVar8 = uVar3 % 3 - 1;
      psVar5 = udy;
      psVar9 = udx;
      if (iVar8 == 0) break;
      iVar7 = uVar3 % 3 + (int)u.ux;
    } while ((0x4e < iVar7 - 2U || 0x14 < (byte)xVar1) ||
            (bVar2 = is_pool(level,iVar7 + -1,iVar4), bVar2 == '\0'));
  }
  else {
    iVar4 = (int)u.ux;
    bVar6 = u.ux - 1;
    do {
      uVar3 = mt_random();
      iVar8 = uVar3 % 3 - 1;
      psVar5 = udx;
      psVar9 = udy;
      if (iVar8 == 0) break;
      uVar3 = (uVar3 % 3 + (int)u.uy) - 1;
    } while ((0x14 < uVar3 || 0x4e < bVar6) ||
            (bVar2 = is_pool(level,iVar4,uVar3), psVar5 = udx, psVar9 = udy, bVar2 == '\0'));
  }
  *psVar5 = '\0';
  *psVar9 = (schar)iVar8;
  pline("Water turbulence affects your movements.");
  return;
}

Assistant:

void water_friction(schar *udx, schar *udy)
{
	int x, y, dx, dy;
	boolean eff = FALSE;

	if (Swimming && rn2(4))
		return;		/* natural swimmers have advantage */

	if (*udx && !rn2(!*udy ? 3 : 6)) {	/* 1/3 chance or half that */
		/* cancel delta x and choose an arbitrary delta y value */
		x = u.ux;
		do {
		    dy = rn2(3) - 1;		/* -1, 0, 1 */
		    y = u.uy + dy;
		} while (dy && (!isok(x,y) || !is_pool(level, x,y)));
		*udx = 0;
		*udy = dy;
		eff = TRUE;
	} else if (*udy && !rn2(!*udx ? 3 : 5)) {	/* 1/3 or 1/5*(5/6) */
		/* cancel delta y and choose an arbitrary delta x value */
		y = u.uy;
		do {
		    dx = rn2(3) - 1;		/* -1 .. 1 */
		    x = u.ux + dx;
		} while (dx && (!isok(x,y) || !is_pool(level, x,y)));
		*udy = 0;
		*udx = dx;
		eff = TRUE;
	}
	if (eff) pline("Water turbulence affects your movements.");
}